

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_array.c
# Opt level: O0

void ares_array_destroy(ares_array_t *arr)

{
  ares_array_destructor_t p_Var1;
  void *pvVar2;
  ulong local_18;
  size_t i;
  ares_array_t *arr_local;
  
  if (arr != (ares_array_t *)0x0) {
    if (arr->destruct != (ares_array_destructor_t)0x0) {
      for (local_18 = 0; local_18 < arr->cnt; local_18 = local_18 + 1) {
        p_Var1 = arr->destruct;
        pvVar2 = ares_array_at(arr,local_18);
        (*p_Var1)(pvVar2);
      }
    }
    ares_free(arr->arr);
    ares_free(arr);
  }
  return;
}

Assistant:

void ares_array_destroy(ares_array_t *arr)
{
  size_t i;

  if (arr == NULL) {
    return;
  }

  if (arr->destruct != NULL) {
    for (i = 0; i < arr->cnt; i++) {
      arr->destruct(ares_array_at(arr, i));
    }
  }

  ares_free(arr->arr);
  ares_free(arr);
}